

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deepidexample.cpp
# Opt level: O0

void drawBlob(vector<std::vector<Rgbaz,_std::allocator<Rgbaz>_>,_std::allocator<std::vector<Rgbaz,_std::allocator<Rgbaz>_>_>_>
              *image,int width,int height,float x,float y,float z,int size,int color,uint32_t *ids)

{
  int in_ECX;
  int in_EDX;
  int in_ESI;
  vector<std::vector<Rgbaz,_std::allocator<Rgbaz>_>,_std::allocator<std::vector<Rgbaz,_std::allocator<Rgbaz>_>_>_>
  *in_RDI;
  float in_XMM0_Da;
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  double dVar5;
  float in_XMM1_Da;
  float scale;
  float dist_sq;
  int i;
  int j;
  Rgbaz point;
  int ptr;
  float sigma;
  float in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int iVar6;
  int iVar7;
  undefined4 local_38;
  
  fVar1 = (float)(in_ECX * 0x28 + 5);
  local_38 = 0;
  Imath_3_2::half::operator=
            ((half *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
             in_stack_ffffffffffffff8c);
  for (iVar7 = 0; iVar7 < in_EDX; iVar7 = iVar7 + 1) {
    for (iVar6 = 0; iVar6 < in_ESI; iVar6 = iVar6 + 1) {
      fVar2 = (in_XMM0_Da - (float)iVar6) * (in_XMM0_Da - (float)iVar6) +
              ((float)iVar7 - in_XMM1_Da) * ((float)iVar7 - in_XMM1_Da);
      dVar5 = std::exp((double)(ulong)(uint)(-fVar2 / fVar1));
      fVar3 = SUB84(dVar5,0);
      dVar5 = std::sqrt((double)(ulong)(uint)fVar2);
      fVar4 = fVar3 * (1.0 - SUB84(dVar5,0) / fVar1);
      if (0.001 < fVar4) {
        Imath_3_2::half::operator_cast_to_float((half *)CONCAT44(fVar3,in_stack_ffffffffffffff90));
        Imath_3_2::half::operator=
                  ((half *)CONCAT44(fVar3,in_stack_ffffffffffffff90),in_stack_ffffffffffffff8c);
        Imath_3_2::half::operator_cast_to_float((half *)CONCAT44(fVar3,in_stack_ffffffffffffff90));
        Imath_3_2::half::operator=
                  ((half *)CONCAT44(fVar3,in_stack_ffffffffffffff90),in_stack_ffffffffffffff8c);
        Imath_3_2::half::operator_cast_to_float((half *)CONCAT44(fVar3,in_stack_ffffffffffffff90));
        Imath_3_2::half::operator=
                  ((half *)CONCAT44(fVar3,in_stack_ffffffffffffff90),in_stack_ffffffffffffff8c);
        Imath_3_2::half::operator=
                  ((half *)CONCAT44(fVar3,in_stack_ffffffffffffff90),in_stack_ffffffffffffff8c);
        std::
        vector<std::vector<Rgbaz,_std::allocator<Rgbaz>_>,_std::allocator<std::vector<Rgbaz,_std::allocator<Rgbaz>_>_>_>
        ::operator[](in_RDI,(long)local_38);
        std::vector<Rgbaz,_std::allocator<Rgbaz>_>::push_back
                  ((vector<Rgbaz,_std::allocator<Rgbaz>_> *)CONCAT44(iVar7,iVar6),
                   (value_type *)CONCAT44(fVar2,fVar4));
      }
      local_38 = local_38 + 1;
    }
  }
  return;
}

Assistant:

void
drawBlob (
    std::vector<std::vector<Rgbaz>>& image,
    int                              width,
    int                              height,
    float                            x,
    float                            y,
    float                            z,
    int                              size,
    int                              color,
    const uint32_t*                  ids)
{
    //
    // draw windowed gaussian centered at (x,y)
    //

    float sigma = 5 + 40 * size;

    int ptr = 0;

    Rgbaz point;
    point.z   = z;
    point.id0 = ids[0];
    point.id1 = ids[1];
    point.id2 = ids[2];
    point.id3 = ids[3];
    point.id4 = ids[4];

    for (int j = 0; j < height; ++j)
    {
        for (int i = 0; i < width; ++i)
        {
            float dist_sq = (x - i) * (x - i) + (j - y) * (j - y);
            float scale =
                exp (-dist_sq / sigma) * (1.f - sqrt (dist_sq) / sigma);

            if (scale > 0.001)
            {
                point.r = colors[color].r * scale;
                point.g = colors[color].g * scale;
                point.b = colors[color].b * scale;
                point.a = scale;

                image[ptr].push_back (point);
            }

            ptr++;
        }
    }
}